

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O1

void xmlRelaxNGFreeDocument(xmlRelaxNGDocumentPtr_conflict docu)

{
  xmlRelaxNGPtr pxVar1;
  long lVar2;
  
  if (docu->href != (xmlChar *)0x0) {
    (*xmlFree)(docu->href);
  }
  if (docu->doc != (xmlDocPtr)0x0) {
    xmlFreeDoc(docu->doc);
  }
  pxVar1 = docu->schema;
  if (pxVar1 != (xmlRelaxNGPtr)0x0) {
    if (pxVar1->doc != (xmlDocPtr)0x0) {
      xmlFreeDoc(pxVar1->doc);
    }
    if (pxVar1->defTab != (xmlRelaxNGDefinePtr_conflict *)0x0) {
      if (0 < pxVar1->defNr) {
        lVar2 = 0;
        do {
          xmlRelaxNGFreeDefine(pxVar1->defTab[lVar2]);
          lVar2 = lVar2 + 1;
        } while (lVar2 < pxVar1->defNr);
      }
      (*xmlFree)(pxVar1->defTab);
    }
    (*xmlFree)(pxVar1);
  }
  (*xmlFree)(docu);
  return;
}

Assistant:

static void
xmlRelaxNGFreeDocument(xmlRelaxNGDocumentPtr docu)
{
    if (docu == NULL)
        return;

    if (docu->href != NULL)
        xmlFree(docu->href);
    if (docu->doc != NULL)
        xmlFreeDoc(docu->doc);
    if (docu->schema != NULL)
        xmlRelaxNGFreeInnerSchema(docu->schema);
    xmlFree(docu);
}